

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettingsByID(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  ImGuiWindowSettings *local_20;
  undefined4 in_stack_fffffffffffffff0;
  ImChunkStream<ImGuiWindowSettings> *in_stack_fffffffffffffff8;
  
  local_20 = ImChunkStream<ImGuiWindowSettings>::begin(&GImGui->SettingsWindows);
  while( true ) {
    if (local_20 == (ImGuiWindowSettings *)0x0) {
      return (ImGuiWindowSettings *)0x0;
    }
    if ((local_20->ID == in_EDI) && ((local_20->WantDelete & 1U) == 0)) break;
    local_20 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                         (in_stack_fffffffffffffff8,
                          (ImGuiWindowSettings *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  }
  return local_20;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id && !settings->WantDelete)
            return settings;
    return NULL;
}